

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onEnterBlockStatementAstNode
          (CompilerAstWalker *this,BlockStatementAstNode *param_1)

{
  element_type *peVar1;
  iterator __position;
  
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  __position._M_current =
       (peVar1->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (peVar1->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&peVar1->scopeStartIndex,
               __position,&peVar1->firstFreeVariablesIndex);
  }
  else {
    *__position._M_current = peVar1->firstFreeVariablesIndex;
    (peVar1->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void onEnterBlockStatementAstNode(BlockStatementAstNode*  /*node*/) noexcept override {
    this->ec->PushScope();
  }